

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O3

CachedInclude * search_cached_include(TCCState *s1,char *filename,int add)

{
  CachedInclude **ppCVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  CachedInclude *pCVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  
  bVar6 = *filename;
  if (bVar6 == 0) {
    uVar8 = 1;
  }
  else {
    pbVar3 = (byte *)(filename + 1);
    uVar7 = 1;
    do {
      uVar7 = (uVar7 >> 0x1b) + (uint)bVar6 + uVar7 * 0x21;
      bVar6 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar6 != 0);
    uVar8 = (ulong)(uVar7 & 0x1f);
  }
  iVar2 = s1->cached_includes_hash[uVar8];
  if (iVar2 != 0) {
    ppCVar1 = s1->cached_includes;
    do {
      pCVar5 = ppCVar1[(long)iVar2 + -1];
      iVar2 = strcmp(pCVar5->filename,filename);
      if (iVar2 == 0) {
        return pCVar5;
      }
      iVar2 = pCVar5->hash_next;
    } while (iVar2 != 0);
  }
  if (add == 0) {
    pCVar5 = (CachedInclude *)0x0;
  }
  else {
    sVar4 = strlen(filename);
    pCVar5 = (CachedInclude *)tcc_malloc(sVar4 + 0x10);
    strcpy(pCVar5->filename,filename);
    pCVar5->ifndef_macro = 0;
    pCVar5->once = 0;
    dynarray_add(&s1->cached_includes,&s1->nb_cached_includes,pCVar5);
    pCVar5->hash_next = s1->cached_includes_hash[uVar8];
    s1->cached_includes_hash[uVar8] = s1->nb_cached_includes;
  }
  return pCVar5;
}

Assistant:

static CachedInclude* search_cached_include(TCCState* s1, const char* filename, int add) {
  const unsigned char* s;
  unsigned int h;
  CachedInclude* e;
  int i;

  h = TOK_HASH_INIT;
  s = (unsigned char*)filename;
  while (*s) {
#ifdef _WIN32
    h = TOK_HASH_FUNC(h, toup(*s));
#else
    h = TOK_HASH_FUNC(h, *s);
#endif
    s++;
  }
  h &= (CACHED_INCLUDES_HASH_SIZE - 1);

  i = s1->cached_includes_hash[h];
  for (;;) {
    if (i == 0)
      break;
    e = s1->cached_includes[i - 1];
    if (0 == PATHCMP(e->filename, filename))
      return e;
    i = e->hash_next;
  }
  if (!add)
    return NULL;

  e = tcc_malloc(sizeof(CachedInclude) + strlen(filename));
  strcpy(e->filename, filename);
  e->ifndef_macro = e->once = 0;
  dynarray_add(&s1->cached_includes, &s1->nb_cached_includes, e);
  /* add in hash table */
  e->hash_next = s1->cached_includes_hash[h];
  s1->cached_includes_hash[h] = s1->nb_cached_includes;
#ifdef INC_DEBUG
  printf("adding cached '%s'\n", filename);
#endif
  return e;
}